

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz.c
# Opt level: O3

size_t duckdb_je_sz_psz_quantize_floor(size_t size)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  
  uVar4 = size - duckdb_je_sz_large_pad;
  if (uVar4 + 1 < 0x7000000000000001) {
    if (uVar4 == 0) {
      uVar3 = 0x40;
    }
    else {
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar3 = (uint)lVar1 ^ 0x3f;
    }
    iVar5 = 0x32 - uVar3;
    if (0x32 < uVar3) {
      iVar5 = 0;
    }
    bVar2 = 0xc;
    if (0x3fff < uVar4) {
      bVar2 = (char)iVar5 + 0xb;
    }
    uVar3 = iVar5 << 2 | (uint)(uVar4 >> (bVar2 & 0x3f)) & 3;
    if (uVar3 == 0) {
      return size;
    }
  }
  else {
    uVar3 = 199;
  }
  return duckdb_je_sz_large_pad + duckdb_je_sz_pind2sz_tab[uVar3 - 1];
}

Assistant:

size_t
sz_psz_quantize_floor(size_t size) {
	size_t ret;
	pszind_t pind;

	assert(size > 0);
	assert((size & PAGE_MASK) == 0);

	pind = sz_psz2ind(size - sz_large_pad + 1);
	if (pind == 0) {
		/*
		 * Avoid underflow.  This short-circuit would also do the right
		 * thing for all sizes in the range for which there are
		 * PAGE-spaced size classes, but it's simplest to just handle
		 * the one case that would cause erroneous results.
		 */
		return size;
	}
	ret = sz_pind2sz(pind - 1) + sz_large_pad;
	assert(ret <= size);
	return ret;
}